

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_1ad1ec::mock_region_factory::init(mock_region_factory *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<pstore::file::in_memory> local_28;
  EVP_PKEY_CTX *local_18;
  mock_region_factory *this_local;
  
  local_18 = ctx;
  this_local = this;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr
            (&local_28,(shared_ptr<pstore::file::in_memory> *)(ctx + 0x18));
  pstore::region::factory::create<pstore::file::in_memory,(anonymous_namespace)::mock_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,&local_28);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr(&local_28);
  return (int)this;
}

Assistant:

auto init () -> std::vector<pstore::region::memory_mapper_ptr> override {
            return this->create<pstore::file::in_memory, mock_mapper> (file_);
        }